

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSemi.c
# Opt level: O2

int Ssw_ManFilterBmc(Ssw_Sem_t *pBmc,int iPat,int fCheckTargets)

{
  Ssw_Man_t *p;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Aig_Man_t *pAVar6;
  void *pvVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  abctime aVar12;
  ulong uVar13;
  long lVar14;
  Aig_Obj_t *p1;
  int iVar15;
  int i;
  
  p = pBmc->pMan;
  aVar5 = Abc_Clock();
  pAVar6 = Aig_ManStart(p->pAig->vObjs->nSize * 3);
  p->pFrames = pAVar6;
  for (iVar15 = 0; pAVar6 = p->pAig, iVar15 < pAVar6->nRegs; iVar15 = iVar15 + 1) {
    pvVar7 = Vec_PtrEntry(pAVar6->vCis,pAVar6->nTruePis + iVar15);
    pvVar8 = Vec_PtrEntry(pBmc->vPatterns,iVar15);
    p->pNodeToFrames[(long)*(int *)((long)pvVar7 + 0x24) * (long)p->nFrames] =
         (Aig_Obj_t *)
         ((ulong)((*(uint *)((long)pvVar8 + (long)(iPat >> 5) * 4) >> (iPat & 0x1fU) & 1) == 0) ^
         (ulong)p->pFrames->pConst1);
  }
  iVar15 = pBmc->nFramesSweep;
  bVar1 = false;
  i = 0;
  iVar4 = iVar15;
  do {
    if (iVar15 <= i) {
LAB_00514d62:
      if (bVar1) {
        pBmc->nConfMax = pBmc->nConfMax / 10;
      }
      Ssw_ClassesCheck(p->ppClasses);
      aVar12 = Abc_Clock();
      p->timeBmc = p->timeBmc + (aVar12 - aVar5);
      return iVar4;
    }
    p->pNodeToFrames[pAVar6->pConst1->Id * p->nFrames + i] = p->pFrames->pConst1;
    for (iVar15 = 0; pAVar6 = p->pAig, iVar15 < pAVar6->nTruePis; iVar15 = iVar15 + 1) {
      pvVar7 = Vec_PtrEntry(pAVar6->vCis,iVar15);
      pAVar9 = Aig_ObjCreateCi(p->pFrames);
      p->pNodeToFrames[*(int *)((long)pvVar7 + 0x24) * p->nFrames + i] = pAVar9;
    }
    for (iVar15 = 0; iVar15 < pAVar6->vObjs->nSize; iVar15 = iVar15 + 1) {
      pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vObjs,iVar15);
      if ((pAVar9 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar9->field_0x18 & 7) - 7)) {
        pAVar6 = p->pFrames;
        pAVar10 = Ssw_ObjChild0Fra(p,pAVar9,i);
        if (((ulong)pAVar9 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswInt.h"
                        ,0xba,"Aig_Obj_t *Ssw_ObjChild1Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
        }
        uVar13 = (ulong)pAVar9->pFanin1 & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)pAVar9->pFanin1 & 1) ^
               (ulong)p->pNodeToFrames[*(int *)(uVar13 + 0x24) * p->nFrames + i]);
        }
        pAVar10 = Aig_And(pAVar6,pAVar10,p1);
        p->pNodeToFrames[pAVar9->Id * p->nFrames + i] = pAVar10;
        iVar3 = Ssw_ManSweepNode(p,pAVar9,i,1,(Vec_Int_t *)0x0);
        if ((iVar3 != 0) && (Ssw_ManFilterBmcSavePattern(pBmc), bVar2 = !bVar1, bVar1 = true, bVar2)
           ) {
          pBmc->nConfMax = pBmc->nConfMax * 10;
          bVar1 = true;
        }
        if (i != 0) {
          lVar11 = (p->pMSat->pSat->stats).conflicts;
          lVar14 = (long)pBmc->nConfMax;
          if (lVar14 <= lVar11) {
            iVar4 = -1;
            goto LAB_00514c9f;
          }
        }
      }
      pAVar6 = p->pAig;
    }
    lVar11 = (p->pMSat->pSat->stats).conflicts;
    lVar14 = (long)pBmc->nConfMax;
LAB_00514c9f:
    if (lVar14 <= lVar11) {
      iVar4 = iVar4 + i + 1;
      goto LAB_00514d62;
    }
    if ((fCheckTargets != 0) && (iVar15 = Ssw_SemCheckTargets(pBmc), iVar15 != 0))
    goto LAB_00514d62;
    for (iVar15 = 0; pAVar6 = p->pAig, iVar15 < pAVar6->nRegs; iVar15 = iVar15 + 1) {
      pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(pAVar6->vCos,pAVar6->nTruePos + iVar15);
      pvVar7 = Vec_PtrEntry(p->pAig->vCis,p->pAig->nTruePis + iVar15);
      pAVar9 = Ssw_ObjChild0Fra(p,pAVar9,i);
      p->pNodeToFrames[*(int *)((long)pvVar7 + 0x24) * p->nFrames + i + 1] = pAVar9;
      Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar9 & 0xfffffffffffffffe));
    }
    iVar15 = pBmc->nFramesSweep;
    i = i + 1;
  } while( true );
}

Assistant:

int Ssw_ManFilterBmc( Ssw_Sem_t * pBmc, int iPat, int fCheckTargets )
{
    Ssw_Man_t * p = pBmc->pMan;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    unsigned * pInfo;
    int i, f, RetValue, fFirst = 0;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * 3 );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( pBmc->vPatterns, i );
        pObjNew = Aig_NotCond( Aig_ManConst1(p->pFrames), !Abc_InfoHasBit(pInfo, iPat) );
        Ssw_ObjSetFrame( p, pObj, 0, pObjNew );
    }

    // sweep internal nodes
    RetValue = pBmc->nFramesSweep;
    for ( f = 0; f < pBmc->nFramesSweep; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            if ( Ssw_ManSweepNode( p, pObj, f, 1, NULL ) )
            {
                Ssw_ManFilterBmcSavePattern( pBmc );
                if ( fFirst == 0 )
                {
                    fFirst = 1;
                    pBmc->nConfMax *= 10;
                }
            }
            if ( f > 0 && p->pMSat->pSat->stats.conflicts >= pBmc->nConfMax )
            {
                RetValue = -1;
                break;
            }
        }
        // quit if this is the last timeframe
        if ( p->pMSat->pSat->stats.conflicts >= pBmc->nConfMax )
        {
            RetValue += f + 1;
            break;
        }
        if ( fCheckTargets && Ssw_SemCheckTargets( pBmc ) )
            break;
        // transfer latch input to the latch outputs 
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjChild0Fra(p, pObjLi,f);
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );
        }
//Abc_Print( 1, "Frame %2d : Conflicts = %6d. \n", f, p->pSat->stats.conflicts );
    }
    if ( fFirst )
        pBmc->nConfMax /= 10;

    // cleanup
    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return RetValue;
}